

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_accounting.c
# Opt level: O3

int mm_acct_save_TCALLST
              (void *db,mm_telco_t *telco,char *terminal_id,
              dlog_mt_summary_call_stats_t *summary_call_stats)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int j;
  long lVar5;
  int j_1;
  char timestamp4_str [20];
  char timestamp3_str [20];
  char received_time_str [16];
  char timestamp2_str [20];
  char timestamp_str [20];
  char sql [1024];
  
  memset(sql,0,0x400);
  received_time_str[0] = '\0';
  received_time_str[1] = '\0';
  received_time_str[2] = '\0';
  received_time_str[3] = '\0';
  received_time_str[4] = '\0';
  received_time_str[5] = '\0';
  received_time_str[6] = '\0';
  received_time_str[7] = '\0';
  received_time_str[8] = '\0';
  received_time_str[9] = '\0';
  received_time_str[10] = '\0';
  received_time_str[0xb] = '\0';
  received_time_str[0xc] = '\0';
  received_time_str[0xd] = '\0';
  received_time_str[0xe] = '\0';
  received_time_str[0xf] = '\0';
  timestamp_str[0x10] = '\0';
  timestamp_str[0x11] = '\0';
  timestamp_str[0x12] = '\0';
  timestamp_str[0x13] = '\0';
  timestamp_str[0] = '\0';
  timestamp_str[1] = '\0';
  timestamp_str[2] = '\0';
  timestamp_str[3] = '\0';
  timestamp_str[4] = '\0';
  timestamp_str[5] = '\0';
  timestamp_str[6] = '\0';
  timestamp_str[7] = '\0';
  timestamp_str[8] = '\0';
  timestamp_str[9] = '\0';
  timestamp_str[10] = '\0';
  timestamp_str[0xb] = '\0';
  timestamp_str[0xc] = '\0';
  timestamp_str[0xd] = '\0';
  timestamp_str[0xe] = '\0';
  timestamp_str[0xf] = '\0';
  timestamp2_str[0x10] = '\0';
  timestamp2_str[0x11] = '\0';
  timestamp2_str[0x12] = '\0';
  timestamp2_str[0x13] = '\0';
  timestamp2_str[0] = '\0';
  timestamp2_str[1] = '\0';
  timestamp2_str[2] = '\0';
  timestamp2_str[3] = '\0';
  timestamp2_str[4] = '\0';
  timestamp2_str[5] = '\0';
  timestamp2_str[6] = '\0';
  timestamp2_str[7] = '\0';
  timestamp2_str[8] = '\0';
  timestamp2_str[9] = '\0';
  timestamp2_str[10] = '\0';
  timestamp2_str[0xb] = '\0';
  timestamp2_str[0xc] = '\0';
  timestamp2_str[0xd] = '\0';
  timestamp2_str[0xe] = '\0';
  timestamp2_str[0xf] = '\0';
  timestamp3_str[0x10] = '\0';
  timestamp3_str[0x11] = '\0';
  timestamp3_str[0x12] = '\0';
  timestamp3_str[0x13] = '\0';
  timestamp3_str[0] = '\0';
  timestamp3_str[1] = '\0';
  timestamp3_str[2] = '\0';
  timestamp3_str[3] = '\0';
  timestamp3_str[4] = '\0';
  timestamp3_str[5] = '\0';
  timestamp3_str[6] = '\0';
  timestamp3_str[7] = '\0';
  timestamp3_str[8] = '\0';
  timestamp3_str[9] = '\0';
  timestamp3_str[10] = '\0';
  timestamp3_str[0xb] = '\0';
  timestamp3_str[0xc] = '\0';
  timestamp3_str[0xd] = '\0';
  timestamp3_str[0xe] = '\0';
  timestamp3_str[0xf] = '\0';
  timestamp4_str[0x10] = '\0';
  timestamp4_str[0x11] = '\0';
  timestamp4_str[0x12] = '\0';
  timestamp4_str[0x13] = '\0';
  timestamp4_str[0] = '\0';
  timestamp4_str[1] = '\0';
  timestamp4_str[2] = '\0';
  timestamp4_str[3] = '\0';
  timestamp4_str[4] = '\0';
  timestamp4_str[5] = '\0';
  timestamp4_str[6] = '\0';
  timestamp4_str[7] = '\0';
  timestamp4_str[8] = '\0';
  timestamp4_str[9] = '\0';
  timestamp4_str[10] = '\0';
  timestamp4_str[0xb] = '\0';
  timestamp4_str[0xc] = '\0';
  timestamp4_str[0xd] = '\0';
  timestamp4_str[0xe] = '\0';
  timestamp4_str[0xf] = '\0';
  pcVar2 = timestamp_to_string(summary_call_stats->start_timestamp,timestamp_str,0x14);
  pcVar3 = timestamp_to_string(summary_call_stats->end_timestamp,timestamp2_str,0x14);
  printf("\t\t\tSummary Call Statistics: From: %s, to: %s:\n",pcVar2,pcVar3);
  lVar5 = 0;
  do {
    pcVar2 = TCALSTE_stats_to_str((uint8_t)lVar5);
    printf("\t\t\t\t%s: %5d\n",pcVar2,(ulong)summary_call_stats->stats[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  printf("\n\t\t\t\tRep Dialer Peg Counts:\t");
  lVar5 = 0;
  do {
    if (lVar5 == 5) {
      printf("\n\t\t\t\t\t\t\t");
    }
    printf("%d, ",(ulong)summary_call_stats->rep_dialer_peg_count[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  seconds_to_ddhhmmss_string(timestamp3_str,0x14,summary_call_stats->total_call_duration);
  printf("\n\t\t\t\tTotal Call duration: %s (%us)\n",timestamp3_str,
         (ulong)summary_call_stats->total_call_duration);
  seconds_to_ddhhmmss_string(timestamp4_str,0x14,summary_call_stats->total_time_off_hook);
  printf("\t\t\t\tTotal Off-hook duration: %s (%us)\n",timestamp4_str,
         (ulong)summary_call_stats->total_time_off_hook);
  printf("\t\t\t\tFree Feature B Call Count: %d\n",(ulong)summary_call_stats->free_featb_call_count)
  ;
  printf("\t\t\t\tCompleted 1-800 billable Count: %d\n",
         (ulong)summary_call_stats->completed_1800_billable_count);
  printf("\t\t\t\tDatajack calls attempted: %d\n",
         (ulong)summary_call_stats->datajack_calls_attempt_count);
  printf("\t\t\t\tDatajack calls completed: %d\n",
         (ulong)summary_call_stats->datajack_calls_complete_count);
  pcVar2 = received_time_to_db_string(received_time_str,0x10);
  pcVar3 = timestamp_to_db_string(summary_call_stats->start_timestamp,timestamp_str,0x14);
  pcVar4 = timestamp_to_db_string(summary_call_stats->end_timestamp,timestamp2_str,0x14);
  snprintf(sql,0x400,
           "INSERT INTO TCALLST(TERMINAL_ID,RECEIVED_DATE, RECEIVED_TIME,SUMMARY_PERIOD_START_DATE,SUMMARY_PERIOD_START_TIME,SUMMARY_PERIOD_STOP_DATE,SUMMARY_PERIOD_STOP_TIME,TOTAL_CARD_CALL_CNT,FREE_CALL_CNT,INCOMING_CALL_CNT,UNANSWERED_CALL_CNT,ABANDONED_CALL_CNT,LOCAL_CARD_CALL_CNT,TOLL_CARD_CALL_CNT,OPERATOR_CALL_CNT,ZERO_PLUS_CALL_CNT,FOLLOW_ON_CALL_CNT,TOTAL_COIN_CALL_CNT,LOCAL_COIN_CALL_CNT,TOLL_COIN_CALL_CNT,FAIL_TO_POTS_COIN_CNT,INTER_LATA_TOLL_CARD_CALL_CNT,INTER_LATA_TOLL_COIN_CALL_CNT,REP_DIALER_PEG_CNT1,REP_DIALER_PEG_CNT2,REP_DIALER_PEG_CNT3,REP_DIALER_PEG_CNT4,REP_DIALER_PEG_CNT5,REP_DIALER_PEG_CNT6,REP_DIALER_PEG_CNT7,REP_DIALER_PEG_CNT8,REP_DIALER_PEG_CNT9,REP_DIALER_PEG_CNT10,TOTAL_CALL_DURATION,TOTAL_TIME_OFF_HOOK,TELCO_ID, REGION_CODE) VALUES ( \"%s\",%s,%s, %s,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,\"%s\", \"%s\",\"%c%c\",\"%c%c%c\");"
           ,terminal_id,pcVar2,pcVar3,pcVar4,(ulong)summary_call_stats->stats[0],
           (ulong)summary_call_stats->stats[1],(ulong)summary_call_stats->stats[2],
           (ulong)summary_call_stats->stats[3],(ulong)summary_call_stats->stats[4],
           (ulong)summary_call_stats->stats[5],(ulong)summary_call_stats->stats[6],
           (ulong)summary_call_stats->stats[7],(ulong)summary_call_stats->stats[8],
           (ulong)summary_call_stats->stats[9],(ulong)summary_call_stats->stats[10],
           (ulong)summary_call_stats->stats[0xb],(ulong)summary_call_stats->stats[0xc],
           (ulong)summary_call_stats->stats[0xd],(ulong)summary_call_stats->stats[0xe],
           (ulong)summary_call_stats->stats[0xf],(ulong)summary_call_stats->rep_dialer_peg_count[0],
           (ulong)summary_call_stats->rep_dialer_peg_count[1],
           (ulong)summary_call_stats->rep_dialer_peg_count[2],
           (ulong)summary_call_stats->rep_dialer_peg_count[3],
           (ulong)summary_call_stats->rep_dialer_peg_count[4],
           (ulong)summary_call_stats->rep_dialer_peg_count[5],
           (ulong)summary_call_stats->rep_dialer_peg_count[6],
           (ulong)summary_call_stats->rep_dialer_peg_count[7],
           (ulong)summary_call_stats->rep_dialer_peg_count[8],
           (ulong)summary_call_stats->rep_dialer_peg_count[9],timestamp3_str,timestamp4_str,
           (ulong)telco->id[0],(ulong)telco->id[1],(ulong)telco->region_code[0],
           (ulong)telco->region_code[1],(ulong)telco->region_code[2]);
  iVar1 = mm_sql_exec(db,sql);
  return iVar1;
}

Assistant:

int mm_acct_save_TCALLST(void *db, mm_telco_t *telco, char* terminal_id, dlog_mt_summary_call_stats_t* summary_call_stats) {
    char sql[1024] = { 0 };
    char received_time_str[16] = { 0 };
    char timestamp_str[20] = { 0 };
    char timestamp2_str[20] = { 0 };
    char timestamp3_str[20] = { 0 };
    char timestamp4_str[20] = { 0 };

    printf("\t\t\tSummary Call Statistics: From: %s, to: %s:\n",
        timestamp_to_string(summary_call_stats->start_timestamp, timestamp_str, sizeof(timestamp_str)),
        timestamp_to_string(summary_call_stats->end_timestamp, timestamp2_str, sizeof(timestamp2_str)));

    for (int j = 0; j < 16; j++) {
        printf("\t\t\t\t%s: %5d\n", TCALSTE_stats_to_str(j), summary_call_stats->stats[j]);
    }
    printf("\n\t\t\t\tRep Dialer Peg Counts:\t");

    for (int j = 0; j < 10; j++) {
        if (j == 5) {
            printf("\n\t\t\t\t\t\t\t");
        }
        printf("%d, ", summary_call_stats->rep_dialer_peg_count[j]);
    }

    seconds_to_ddhhmmss_string(timestamp3_str, sizeof(timestamp3_str), summary_call_stats->total_call_duration);
    printf("\n\t\t\t\tTotal Call duration: %s (%us)\n",
        timestamp3_str, summary_call_stats->total_call_duration);

    seconds_to_ddhhmmss_string(timestamp4_str, sizeof(timestamp4_str), summary_call_stats->total_time_off_hook);
    printf("\t\t\t\tTotal Off-hook duration: %s (%us)\n", timestamp4_str, summary_call_stats->total_time_off_hook);

    printf("\t\t\t\tFree Feature B Call Count: %d\n", summary_call_stats->free_featb_call_count);
    printf("\t\t\t\tCompleted 1-800 billable Count: %d\n", summary_call_stats->completed_1800_billable_count);
    printf("\t\t\t\tDatajack calls attempted: %d\n", summary_call_stats->datajack_calls_attempt_count);
    printf("\t\t\t\tDatajack calls completed: %d\n", summary_call_stats->datajack_calls_complete_count);

    snprintf(sql, sizeof(sql), "INSERT " SQL_IGNORE "INTO TCALLST("
        "TERMINAL_ID,"
        "RECEIVED_DATE, RECEIVED_TIME,"
        "SUMMARY_PERIOD_START_DATE,SUMMARY_PERIOD_START_TIME,"
        "SUMMARY_PERIOD_STOP_DATE,SUMMARY_PERIOD_STOP_TIME,"
        "TOTAL_CARD_CALL_CNT,"
        "FREE_CALL_CNT,"
        "INCOMING_CALL_CNT,"
        "UNANSWERED_CALL_CNT,"
        "ABANDONED_CALL_CNT,"
        "LOCAL_CARD_CALL_CNT,"
        "TOLL_CARD_CALL_CNT,"
        "OPERATOR_CALL_CNT,"
        "ZERO_PLUS_CALL_CNT,"
        "FOLLOW_ON_CALL_CNT,"
        "TOTAL_COIN_CALL_CNT,"
        "LOCAL_COIN_CALL_CNT,"
        "TOLL_COIN_CALL_CNT,"
        "FAIL_TO_POTS_COIN_CNT,"
        "INTER_LATA_TOLL_CARD_CALL_CNT,"
        "INTER_LATA_TOLL_COIN_CALL_CNT,"
        "REP_DIALER_PEG_CNT1,"
        "REP_DIALER_PEG_CNT2,"
        "REP_DIALER_PEG_CNT3,"
        "REP_DIALER_PEG_CNT4,"
        "REP_DIALER_PEG_CNT5,"
        "REP_DIALER_PEG_CNT6,"
        "REP_DIALER_PEG_CNT7,"
        "REP_DIALER_PEG_CNT8,"
        "REP_DIALER_PEG_CNT9,"
        "REP_DIALER_PEG_CNT10,"
        "TOTAL_CALL_DURATION,"
        "TOTAL_TIME_OFF_HOOK,"
        "TELCO_ID, REGION_CODE"
        ") VALUES ( "
        "\"%s\",%s,"
        "%s, %s,"
        "%d,%d,%d,%d,%d,%d,%d,%d,"
        "%d,%d,%d,%d,%d,%d,%d,%d,"
        "%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,"    /* Rep dialer peg counts */
        "\"%s\", \"%s\"," TELCO_ID_REGION_CODE ");",
        terminal_id,
        received_time_to_db_string(received_time_str, sizeof(received_time_str)),
        timestamp_to_db_string(summary_call_stats->start_timestamp, timestamp_str, sizeof(timestamp_str)),
        timestamp_to_db_string(summary_call_stats->end_timestamp, timestamp2_str, sizeof(timestamp2_str)),
        summary_call_stats->stats[0], summary_call_stats->stats[1], summary_call_stats->stats[2], summary_call_stats->stats[3],
        summary_call_stats->stats[4], summary_call_stats->stats[5], summary_call_stats->stats[6], summary_call_stats->stats[7],
        summary_call_stats->stats[8], summary_call_stats->stats[9], summary_call_stats->stats[10], summary_call_stats->stats[11],
        summary_call_stats->stats[12], summary_call_stats->stats[13], summary_call_stats->stats[14], summary_call_stats->stats[15],
        summary_call_stats->rep_dialer_peg_count[0], summary_call_stats->rep_dialer_peg_count[1],
        summary_call_stats->rep_dialer_peg_count[2], summary_call_stats->rep_dialer_peg_count[3],
        summary_call_stats->rep_dialer_peg_count[4], summary_call_stats->rep_dialer_peg_count[5],
        summary_call_stats->rep_dialer_peg_count[6], summary_call_stats->rep_dialer_peg_count[7],
        summary_call_stats->rep_dialer_peg_count[8], summary_call_stats->rep_dialer_peg_count[9],
        timestamp3_str,
        timestamp4_str,
        telco->id[0], telco->id[1],
        telco->region_code[0], telco->region_code[1], telco->region_code[2]);

    return mm_sql_exec(db, sql);
}